

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

void __thiscall
cmCMakePresetsGraph::PrintConfigurePresetList
          (cmCMakePresetsGraph *this,PrintPrecedingNewline *newline)

{
  anon_class_1_0_00000001 local_39;
  function<bool_(const_cmCMakePresetsGraph::ConfigurePreset_&)> local_38;
  PrintPrecedingNewline *local_18;
  PrintPrecedingNewline *newline_local;
  cmCMakePresetsGraph *this_local;
  
  local_18 = newline;
  newline_local = (PrintPrecedingNewline *)this;
  std::function<bool(cmCMakePresetsGraph::ConfigurePreset_const&)>::
  function<cmCMakePresetsGraph::PrintConfigurePresetList(cmCMakePresetsGraph::PrintPrecedingNewline*)const::__0,void>
            ((function<bool(cmCMakePresetsGraph::ConfigurePreset_const&)> *)&local_38,&local_39);
  PrintConfigurePresetList(this,&local_38,local_18);
  std::function<bool_(const_cmCMakePresetsGraph::ConfigurePreset_&)>::~function(&local_38);
  return;
}

Assistant:

void cmCMakePresetsGraph::PrintConfigurePresetList(
  PrintPrecedingNewline* newline) const
{
  PrintConfigurePresetList([](const ConfigurePreset&) { return true; },
                           newline);
}